

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_0::getTexelBlockStride
          (anon_unknown_0 *this,ImageInfo *info,int level)

{
  int iVar1;
  IVec3 IVar2;
  IVec3 textureTexelBlockSize;
  IVec3 texelBlockPixelSize;
  IVec3 size;
  int local_4c;
  int local_48;
  anon_unknown_0 local_40 [12];
  anon_unknown_0 local_34 [12];
  
  getLevelSize(local_34,info->m_target,&info->m_size,level);
  iVar1 = getTexelBlockSize(info->m_format);
  getTexelBlockPixelSize(local_40,info->m_format);
  IVar2 = divRoundUp((anon_unknown_0 *)&local_4c,(IVec3 *)local_34,(IVec3 *)local_40);
  *(int *)this = iVar1;
  *(int *)(this + 4) = local_4c * iVar1;
  *(int *)(this + 8) = local_48 * local_4c * iVar1;
  IVar2.m_data._0_8_ = this;
  return (IVec3)IVar2.m_data;
}

Assistant:

IVec3 getTexelBlockStride (const ImageInfo& info, int level)
{
	const IVec3	size					= getLevelSize(info.getTarget(), info.getSize(), level);
	const int	texelBlockSize			= getTexelBlockSize(info.getFormat());
	const IVec3 texelBlockPixelSize		= getTexelBlockPixelSize(info.getFormat());
	const IVec3 textureTexelBlockSize	= divRoundUp(size, texelBlockPixelSize);

	return IVec3(texelBlockSize, textureTexelBlockSize.x() * texelBlockSize, textureTexelBlockSize.x() * textureTexelBlockSize.y() * texelBlockSize);
}